

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::deleteMetadata
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path)

{
  Client *client;
  Url local_48;
  Path *local_20;
  Path *path_local;
  KeyValue *this_local;
  
  local_20 = path;
  path_local = (Path *)this;
  this_local = (KeyValue *)__return_storage_ptr__;
  if (this->version_ == v2) {
    client = this->client_;
    getMetadataUrl(&local_48,this,path);
    HttpConsumer::del(__return_storage_ptr__,client,&local_48);
    Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny(&local_48);
  }
  else {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::KeyValue::deleteMetadata(const Path &path) {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::del(client_, getMetadataUrl(path));
}